

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

TestCaseGroup * deqp::egl::createRobustnessTests(EglTestContext *eglTestCtx)

{
  string *__lhs;
  char *pcVar1;
  char *pcVar2;
  _Alloc_hider _Var3;
  ResourceType RVar4;
  RobustAccessType RVar5;
  int iVar6;
  TestCaseGroup *pTVar7;
  TestCaseGroup *pTVar8;
  TestNode *pTVar9;
  RobustnessTestCase *pRVar10;
  TestCaseGroup *pTVar11;
  TestCaseGroup *pTVar12;
  TestCaseGroup *this;
  Params *pPVar13;
  Params *this_00;
  long lVar14;
  bool bVar15;
  allocator<char> local_1048;
  allocator<char> local_1047;
  allocator<char> local_1046;
  allocator<char> local_1045;
  allocator<char> local_1044;
  allocator<char> local_1043;
  allocator<char> local_1042;
  allocator<char> local_1041;
  allocator<char> local_1040;
  allocator<char> local_103f;
  allocator<char> local_103e;
  allocator<char> local_103d;
  allocator<char> local_103c;
  allocator<char> local_103b;
  allocator<char> local_103a;
  allocator<char> local_1039;
  allocator<char> local_1038;
  allocator<char> local_1037;
  allocator<char> local_1036;
  allocator<char> local_1035;
  allocator<char> local_1034;
  allocator<char> local_1033;
  allocator<char> local_1032;
  allocator<char> local_1031;
  allocator<char> local_1030;
  allocator<char> local_102f;
  allocator<char> local_102e;
  allocator<char> local_102d;
  allocator<char> local_102c;
  allocator<char> local_102b;
  allocator<char> local_102a;
  allocator<char> local_1029;
  allocator<char> local_1028;
  allocator<char> local_1027;
  allocator<char> local_1026;
  allocator<char> local_1025;
  allocator<char> local_1024;
  allocator<char> local_1023;
  allocator<char> local_1022;
  allocator<char> local_1021;
  allocator<char> local_1020;
  allocator<char> local_101f;
  allocator<char> local_101e;
  allocator<char> local_101d;
  allocator<char> local_101c;
  allocator<char> local_101b;
  allocator<char> local_101a;
  allocator<char> local_1019;
  TestCaseGroup *local_1018;
  TestCaseGroup *local_1010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1008;
  TestCaseGroup *local_fe8;
  TestCaseGroup *local_fe0;
  TestCaseGroup *local_fd8;
  TestCaseGroup *local_fd0;
  Params local_fc8;
  TestCaseGroup *local_f70;
  TestCaseGroup *local_f68;
  TestCaseGroup *local_f60;
  TestCaseGroup *local_f58;
  TestCaseGroup *local_f50;
  TestCaseGroup *local_f48;
  TestCaseGroup *local_f40;
  TestCaseGroup *local_f38;
  TestCaseGroup *local_f30;
  TestCaseGroup *local_f28;
  TestCaseGroup *local_f20;
  TestCaseGroup *local_f18;
  TestCaseGroup *local_f10;
  string local_f08;
  string local_ee8;
  string local_ec8;
  string local_ea8;
  string local_e88;
  string local_e68;
  string resetScenarioDescription;
  ReadWriteType local_e28;
  ResourceType local_e24;
  ResourceType local_e20;
  ReadWriteType local_e1c;
  ReadWriteType local_e18;
  ReadWriteType local_e14;
  ResourceType local_e10;
  ShaderType local_e0c;
  ReadWriteType local_e08;
  ReadWriteType local_e04;
  ReadWriteType local_e00;
  ResourceType local_dfc;
  ReadWriteType local_df8;
  ReadWriteType local_df4;
  ReadWriteType local_df0;
  ReadWriteType local_dec;
  ResourceType local_de8;
  ShaderType local_de4;
  ReadWriteType local_de0;
  ReadWriteType local_ddc;
  ReadWriteType local_dd8;
  ReadWriteType local_dd4;
  ShaderType local_dd0;
  ReadWriteType local_dcc;
  ReadWriteType local_dc8;
  ReadWriteType local_dc4;
  ReadWriteType local_dc0;
  ShaderType local_dbc;
  ReadWriteType local_db8;
  ReadWriteType local_db4;
  ReadWriteType local_db0;
  ReadWriteType local_dac;
  ReadWriteType local_da8;
  ReadWriteType local_da4;
  ReadWriteType local_da0;
  ReadWriteType local_d9c;
  ReadWriteType local_d98;
  ShaderType local_d94;
  ReadWriteType local_d90;
  ReadWriteType local_d8c;
  ReadWriteType local_d88;
  ResourceType local_d84;
  ShaderType local_d80;
  ReadWriteType local_d7c;
  ReadWriteType local_d78;
  ReadWriteType local_d74;
  ResourceType local_d70;
  ShaderType local_d6c;
  ReadWriteType local_d68;
  ReadWriteType local_d64;
  ReadWriteType local_d60;
  ResourceType local_d5c;
  ReadWriteType local_d58;
  ReadWriteType local_d54;
  ReadWriteType local_d50;
  ReadWriteType local_d4c;
  ResourceType local_d48;
  ShaderType local_d44;
  ReadWriteType local_d40;
  ReadWriteType local_d3c;
  ReadWriteType local_d38;
  ResourceType local_d34;
  ResourceType local_d30;
  ReadWriteType local_d2c;
  RobustAccessType local_d28;
  ReadWriteType local_d24;
  ResourceType local_d20;
  ShaderType local_d1c;
  ReadWriteType local_d18;
  RobustAccessType local_d14;
  ReadWriteType local_d10;
  ResourceType local_d0c;
  ReadWriteType local_d08;
  ReadWriteType local_d04;
  RobustAccessType local_d00;
  ReadWriteType local_cfc;
  ResourceType local_cf8;
  ShaderType local_cf4;
  ReadWriteType local_cf0;
  RobustAccessType local_cec;
  ReadWriteType local_ce8;
  ReadWriteType local_ce4;
  ShaderType local_ce0;
  ReadWriteType local_cdc;
  RobustAccessType local_cd8;
  ReadWriteType local_cd4;
  ReadWriteType local_cd0;
  ShaderType local_ccc;
  ReadWriteType local_cc8;
  RobustAccessType local_cc4;
  ReadWriteType local_cc0;
  ReadWriteType local_cbc;
  ReadWriteType local_cb8;
  ReadWriteType local_cb4;
  RobustAccessType local_cb0;
  ReadWriteType local_cac;
  ReadWriteType local_ca8;
  ShaderType local_ca4;
  ReadWriteType local_ca0;
  RobustAccessType local_c9c;
  ReadWriteType local_c98;
  ResourceType local_c94;
  ShaderType local_c90;
  ReadWriteType local_c8c;
  RobustAccessType local_c88;
  ReadWriteType local_c84;
  ResourceType local_c80;
  ShaderType local_c7c;
  ReadWriteType local_c78;
  RobustAccessType local_c74;
  ReadWriteType local_c70;
  ResourceType local_c6c;
  ReadWriteType local_c68;
  ReadWriteType local_c64;
  RobustAccessType local_c60;
  ReadWriteType local_c5c;
  ResourceType local_c58;
  ShaderType local_c54;
  ReadWriteType local_c50;
  RobustAccessType local_c4c;
  MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_> group;
  string local_c38;
  string local_c18;
  string local_bf8;
  string local_bd8;
  string local_bb8;
  string local_b98;
  string local_b78;
  string local_b58;
  string local_b38;
  string local_b18;
  string local_af8;
  string local_ad8;
  string local_ab8;
  string local_a98;
  string local_a78;
  string local_a58;
  string local_a38;
  string local_a18;
  string local_9f8;
  string local_9d8;
  string local_9b8;
  string local_998;
  string local_978;
  string local_958;
  string local_938;
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string recoverScenarioDescription;
  string sharedScenarioDescription;
  string queryScenarioDescription;
  string syncScenarioDescription;
  Params local_6b8;
  Params local_660;
  Params local_608;
  Params local_5b0;
  Params local_558;
  Params local_500;
  Params local_4a8;
  Params local_450;
  Params local_3f8;
  Params local_3a0;
  Params local_348;
  Params local_2f0;
  Params local_298;
  Params local_240;
  Params local_1e8;
  Params local_190;
  Params local_138;
  Params local_e0;
  Params local_88;
  
  pTVar7 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar7,eglTestCtx,"robustness","KHR_robustness tests");
  group.super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>.
  m_data.ptr = pTVar7;
  local_f60 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_f60,eglTestCtx,"create_context","Test valid context_creation attributes");
  local_f70 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_f70,eglTestCtx,"reset_context","Test context resets scenarios")
  ;
  local_f50 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_f50,eglTestCtx,"negative_context","Test invalid context creation attributes");
  local_f68 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_f68,eglTestCtx,"shaders","Shader specific context reset tests")
  ;
  pTVar7 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar7,eglTestCtx,"fixed_function_pipeline",
             "Fixed function pipeline context reset tests with robust context");
  local_f48 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_f48,eglTestCtx,"fixed_function_pipeline_non_robust",
             "Fixed function pipeline context reset tests with non-robust context");
  local_f30 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_f30,eglTestCtx,"infinite_loop","Infinite loop scenarios");
  local_f38 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_f38,eglTestCtx,"out_of_bounds",
             "Out of bounds access scenarios with robust context");
  local_f40 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_f40,eglTestCtx,"out_of_bounds_non_robust",
             "Out of bounds access scenarios with non-robust context");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&resetScenarioDescription,"query error states and reset notifications",
             (allocator<char> *)&local_fc8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&syncScenarioDescription,"query sync status with getSynciv()",
             (allocator<char> *)&local_fc8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&queryScenarioDescription,
             "check availability of query result with getQueryObjectiv()",
             (allocator<char> *)&local_fc8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sharedScenarioDescription,
             "check reset notification is propagated to shared context",
             (allocator<char> *)&local_fc8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&recoverScenarioDescription,"delete the old context and create a new one",
             (allocator<char> *)&local_fc8);
  pTVar8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar8,eglTestCtx,"reset_status",
             "Tests that query the reset status after a context reset has occurred");
  local_fd8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_fd8,eglTestCtx,"sync_status",
             "Tests that query the sync status after a context reset has occurred");
  local_fe0 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_fe0,eglTestCtx,"query_status",
             "Tests that query the state of a query object after a context reset has occurred");
  local_fe8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_fe8,eglTestCtx,"shared_context_status",
             "Tests that query the state of a shared context after a reset has occurred");
  local_1010 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_1010,eglTestCtx,"recover_from_reset",
             "Tests that attempt to create a new context after a context has occurred");
  local_fd0 = pTVar8;
  if (createRobustnessTests(deqp::egl::EglTestContext&)::s_infiniteLoopCases == '\0') {
    iVar6 = __cxa_guard_acquire(&createRobustnessTests(deqp::egl::EglTestContext&)::
                                 s_infiniteLoopCases);
    if (iVar6 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_fc8,"vertex",(allocator<char> *)&local_b58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1008,"Provoke a context reset in vertex shader and ",
                 (allocator<char> *)&local_b78);
      local_a58._M_dataplus._M_p._0_4_ = 0;
      local_a78._M_dataplus._M_p._0_4_ = 0;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_infiniteLoopCases,&local_fc8.m_name,&local_1008,
                 (ContextResetType *)&local_a58,(ShaderType *)&local_a78);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e68,"fragment",(allocator<char> *)&local_b98);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e88,"Provoke a context reset in fragment shader and ",
                 (allocator<char> *)&local_bb8);
      local_a98._M_dataplus._M_p._0_4_ = 0;
      local_ab8._M_dataplus._M_p._0_4_ = 1;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_infiniteLoopCases + 1,&local_e68,&local_e88,
                 (ContextResetType *)&local_a98,(ShaderType *)&local_ab8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ea8,"vertex_and_fragment",(allocator<char> *)&local_bd8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ec8,"Provoke a context reset in vertex and fragment shader and ",
                 (allocator<char> *)&local_bf8);
      local_ad8._M_dataplus._M_p._0_4_ = 0;
      local_af8._M_dataplus._M_p._0_4_ = 3;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_infiniteLoopCases + 2,&local_ea8,&local_ec8,
                 (ContextResetType *)&local_ad8,(ShaderType *)&local_af8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ee8,"compute",(allocator<char> *)&local_c18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f08,"Provoke a context reset in compute shader and ",
                 (allocator<char> *)&local_c38);
      local_b18._M_dataplus._M_p._0_4_ = 0;
      local_b38._M_dataplus._M_p._0_4_ = 2;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_infiniteLoopCases + 3,&local_ee8,&local_f08,
                 (ContextResetType *)&local_b18,(ShaderType *)&local_b38);
      std::__cxx11::string::~string((string *)&local_f08);
      std::__cxx11::string::~string((string *)&local_ee8);
      std::__cxx11::string::~string((string *)&local_ec8);
      std::__cxx11::string::~string((string *)&local_ea8);
      std::__cxx11::string::~string((string *)&local_e88);
      std::__cxx11::string::~string((string *)&local_e68);
      std::__cxx11::string::~string((string *)&local_1008);
      std::__cxx11::string::~string((string *)&local_fc8);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&createRobustnessTests(deqp::egl::EglTestContext&)::s_infiniteLoopCases);
    }
  }
  local_f58 = (TestCaseGroup *)0x4;
  local_1018 = (TestCaseGroup *)createRobustnessTests::s_infiniteLoopCases;
  while( true ) {
    pTVar8 = local_f30;
    bVar15 = local_f58 == (TestCaseGroup *)0x0;
    local_f58 = (TestCaseGroup *)((long)local_f58 + -1);
    if (bVar15) break;
    pTVar9 = (TestNode *)operator_new(0xf8);
    pTVar8 = local_1018;
    pcVar1 = (((string *)&local_1018->super_TestCaseGroup)->_M_dataplus)._M_p;
    __lhs = (string *)((long)local_1018 + 0x20);
    std::operator+(&local_fc8.m_name,__lhs,&resetScenarioDescription);
    _Var3._M_p = local_fc8.m_name._M_dataplus._M_p;
    anon_unknown_1::RobustnessTestCase::Params::Params(&local_660,(Params *)pTVar8);
    anon_unknown_1::BasicResetCase::BasicResetCase
              ((BasicResetCase *)pTVar9,eglTestCtx,pcVar1,_Var3._M_p,&local_660);
    tcu::TestNode::addChild((TestNode *)local_fd0,pTVar9);
    anon_unknown_1::RobustnessTestCase::Params::~Params(&local_660);
    std::__cxx11::string::~string((string *)&local_fc8);
    pTVar9 = (TestNode *)operator_new(0xf8);
    pcVar1 = (((string *)&pTVar8->super_TestCaseGroup)->_M_dataplus)._M_p;
    std::operator+(&local_1008,__lhs,&syncScenarioDescription);
    _Var3._M_p = local_1008._M_dataplus._M_p;
    anon_unknown_1::RobustnessTestCase::Params::Params(&local_500,(Params *)pTVar8);
    anon_unknown_1::RobustnessTestCase::Params::Params(&local_fc8,&local_500);
    anon_unknown_1::ContextResetCase::ContextResetCase
              ((ContextResetCase *)pTVar9,eglTestCtx,pcVar1,_Var3._M_p,&local_fc8);
    anon_unknown_1::RobustnessTestCase::Params::~Params(&local_fc8);
    pTVar9->_vptr_TestNode = (_func_int **)&PTR__RobustnessTestCase_01e0b430;
    tcu::TestNode::addChild((TestNode *)local_fd8,pTVar9);
    anon_unknown_1::RobustnessTestCase::Params::~Params(&local_500);
    std::__cxx11::string::~string((string *)&local_1008);
    pTVar9 = (TestNode *)operator_new(0xf8);
    pcVar1 = (((string *)&pTVar8->super_TestCaseGroup)->_M_dataplus)._M_p;
    std::operator+(&local_1008,__lhs,&queryScenarioDescription);
    _Var3._M_p = local_1008._M_dataplus._M_p;
    anon_unknown_1::RobustnessTestCase::Params::Params(&local_558,(Params *)pTVar8);
    anon_unknown_1::RobustnessTestCase::Params::Params(&local_fc8,&local_558);
    anon_unknown_1::ContextResetCase::ContextResetCase
              ((ContextResetCase *)pTVar9,eglTestCtx,pcVar1,_Var3._M_p,&local_fc8);
    anon_unknown_1::RobustnessTestCase::Params::~Params(&local_fc8);
    pTVar9->_vptr_TestNode = (_func_int **)&PTR__RobustnessTestCase_01e0b498;
    tcu::TestNode::addChild((TestNode *)local_fe0,pTVar9);
    anon_unknown_1::RobustnessTestCase::Params::~Params(&local_558);
    std::__cxx11::string::~string((string *)&local_1008);
    pRVar10 = (RobustnessTestCase *)operator_new(0xf8);
    pcVar1 = (((string *)&pTVar8->super_TestCaseGroup)->_M_dataplus)._M_p;
    std::operator+(&local_1008,__lhs,&sharedScenarioDescription);
    _Var3._M_p = local_1008._M_dataplus._M_p;
    anon_unknown_1::RobustnessTestCase::Params::Params(&local_5b0,(Params *)pTVar8);
    anon_unknown_1::RobustnessTestCase::Params::Params(&local_fc8,&local_5b0);
    anon_unknown_1::RobustnessTestCase::RobustnessTestCase
              (pRVar10,eglTestCtx,pcVar1,_Var3._M_p,&local_fc8);
    anon_unknown_1::RobustnessTestCase::Params::~Params(&local_fc8);
    (pRVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__RobustnessTestCase_01e0b500;
    tcu::TestNode::addChild((TestNode *)local_fe8,(TestNode *)pRVar10);
    anon_unknown_1::RobustnessTestCase::Params::~Params(&local_5b0);
    std::__cxx11::string::~string((string *)&local_1008);
    pRVar10 = (RobustnessTestCase *)operator_new(0xf8);
    pcVar1 = (((string *)&pTVar8->super_TestCaseGroup)->_M_dataplus)._M_p;
    std::operator+(&local_1008,__lhs,&recoverScenarioDescription);
    _Var3._M_p = local_1008._M_dataplus._M_p;
    anon_unknown_1::RobustnessTestCase::Params::Params(&local_608,(Params *)pTVar8);
    anon_unknown_1::RobustnessTestCase::Params::Params(&local_fc8,&local_608);
    anon_unknown_1::RobustnessTestCase::RobustnessTestCase
              (pRVar10,eglTestCtx,pcVar1,_Var3._M_p,&local_fc8);
    anon_unknown_1::RobustnessTestCase::Params::~Params(&local_fc8);
    (pRVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__RobustnessTestCase_01e0b550;
    tcu::TestNode::addChild((TestNode *)local_1010,(TestNode *)pRVar10);
    anon_unknown_1::RobustnessTestCase::Params::~Params(&local_608);
    std::__cxx11::string::~string((string *)&local_1008);
    local_1018 = (TestCaseGroup *)((long)local_1018 + 0x58);
  }
  tcu::TestNode::addChild((TestNode *)local_f30,(TestNode *)local_fd0);
  tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)local_fd8);
  tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)local_fe0);
  tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)local_fe8);
  tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)local_1010);
  pTVar8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar8,eglTestCtx,"uniform_block","Uniform Block Accesses");
  pTVar11 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar11,eglTestCtx,"uniform_block","Uniform Block Accesses");
  local_f58 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_f58,eglTestCtx,"shader_storage_block","Shader Storage Block accesses");
  local_1010 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_1010,eglTestCtx,"shader_storage_block","Shader Storage Block accesses");
  local_f28 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_f28,eglTestCtx,"local_array","Local array accesses");
  local_f20 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_f20,eglTestCtx,"local_array","Local array accesses");
  local_fd0 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_fd0,eglTestCtx,"uniform_block","Uniform Block Accesses");
  pTVar12 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar12,eglTestCtx,"uniform_block","Uniform Block Accesses");
  this = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this,eglTestCtx,"shader_storage_block","Shader Storage Block accesses");
  local_1018 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_1018,eglTestCtx,"shader_storage_block","Shader Storage Block accesses");
  local_f18 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_f18,eglTestCtx,"local_array","Local array accesses");
  local_f10 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_f10,eglTestCtx,"local_array","Local array accesses");
  local_fe8 = pTVar11;
  local_fe0 = pTVar8;
  local_fd8 = pTVar12;
  if (createRobustnessTests(deqp::egl::EglTestContext&)::s_outOfBoundReadCases == '\0') {
    iVar6 = __cxa_guard_acquire(&createRobustnessTests(deqp::egl::EglTestContext&)::
                                 s_outOfBoundReadCases);
    if (iVar6 != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_fc8,"vertex",&local_1019);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1008,"Provoke a context reset in vertex shader and ",&local_101a);
      local_c4c = ROBUSTACCESS_TRUE;
      local_c50 = READWRITETYPE_WRITE;
      local_c54 = SHADERTYPE_VERT;
      local_c58 = RESOURCETYPE_UBO;
      local_c5c = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases,&local_fc8.m_name,&local_1008,
                 &local_c4c,&local_c50,&local_c54,&local_c58,&local_c5c);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e68,"fragment",&local_101b);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e88,"Provoke a context reset in fragment shader and ",&local_101c)
      ;
      local_c60 = ROBUSTACCESS_TRUE;
      local_c68 = READWRITETYPE_WRITE;
      local_c6c = RESOURCETYPE_UBO;
      local_c70 = READWRITETYPE_READ;
      local_c64 = local_c68;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 1,&local_e68,&local_e88,&local_c60,
                 &local_c64,&local_c68,&local_c6c,&local_c70);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ea8,"vertex_and_fragment",&local_101d);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ec8,"Provoke a context reset in vertex and fragment shader and ",
                 &local_101e);
      local_c74 = ROBUSTACCESS_TRUE;
      local_c78 = READWRITETYPE_WRITE;
      local_c7c = SHADERTYPE_VERT_AND_FRAG;
      local_c80 = RESOURCETYPE_UBO;
      local_c84 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 2,&local_ea8,&local_ec8,&local_c74,
                 &local_c78,&local_c7c,&local_c80,&local_c84);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ee8,"compute",&local_101f)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f08,"Provoke a context reset in compute shader and ",&local_1020);
      local_c88 = ROBUSTACCESS_TRUE;
      local_c8c = READWRITETYPE_WRITE;
      local_c90 = SHADERTYPE_COMPUTE;
      local_c94 = RESOURCETYPE_UBO;
      local_c98 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 3,&local_ee8,&local_f08,&local_c88,
                 &local_c8c,&local_c90,&local_c94,&local_c98);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a58,"vertex",&local_1021);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a78,"Provoke a context reset in vertex shader and ",&local_1022);
      local_c9c = ROBUSTACCESS_TRUE;
      local_ca4 = SHADERTYPE_VERT;
      local_ca8 = READWRITETYPE_WRITE;
      local_cac = READWRITETYPE_READ;
      local_ca0 = local_ca8;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 4,&local_a58,&local_a78,&local_c9c,
                 &local_ca0,&local_ca4,&local_ca8,&local_cac);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a98,"fragment",&local_1023);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ab8,"Provoke a context reset in fragment shader and ",&local_1024)
      ;
      local_cb0 = ROBUSTACCESS_TRUE;
      local_cbc = READWRITETYPE_WRITE;
      local_cc0 = READWRITETYPE_READ;
      local_cb8 = local_cbc;
      local_cb4 = local_cbc;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 5,&local_a98,&local_ab8,&local_cb0,
                 &local_cb4,&local_cb8,&local_cbc,&local_cc0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ad8,"vertex_and_fragment",&local_1025);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_af8,"Provoke a context reset in vertex and fragment shader and ",
                 &local_1026);
      local_cc4 = ROBUSTACCESS_TRUE;
      local_cd0 = READWRITETYPE_WRITE;
      local_ccc = SHADERTYPE_VERT_AND_FRAG;
      local_cd4 = READWRITETYPE_READ;
      local_cc8 = local_cd0;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 6,&local_ad8,&local_af8,&local_cc4,
                 &local_cc8,&local_ccc,&local_cd0,&local_cd4);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b18,"compute",&local_1027)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b38,"Provoke a context reset in compute shader and ",&local_1028);
      local_cd8 = ROBUSTACCESS_TRUE;
      local_ce4 = READWRITETYPE_WRITE;
      local_ce0 = SHADERTYPE_COMPUTE;
      local_ce8 = READWRITETYPE_READ;
      local_cdc = local_ce4;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 7,&local_b18,&local_b38,&local_cd8,
                 &local_cdc,&local_ce0,&local_ce4,&local_ce8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b58,"vertex",&local_1029);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b78,"Provoke a context reset in vertex shader and ",&local_102a);
      local_cec = ROBUSTACCESS_TRUE;
      local_cf4 = SHADERTYPE_VERT;
      local_cf0 = READWRITETYPE_WRITE;
      local_cf8 = RESOURCETYPE_LOCAL_ARRAY;
      local_cfc = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 8,&local_b58,&local_b78,&local_cec,
                 &local_cf0,&local_cf4,&local_cf8,&local_cfc);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b98,"fragment",&local_102b);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_bb8,"Provoke a context reset in fragment shader and ",&local_102c)
      ;
      local_d00 = ROBUSTACCESS_TRUE;
      local_d08 = READWRITETYPE_WRITE;
      local_d0c = RESOURCETYPE_LOCAL_ARRAY;
      local_d10 = READWRITETYPE_READ;
      local_d04 = local_d08;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 9,&local_b98,&local_bb8,&local_d00,
                 &local_d04,&local_d08,&local_d0c,&local_d10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_bd8,"vertex_and_fragment",&local_102d);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_bf8,"Provoke a context reset in vertex and fragment shader and ",
                 &local_102e);
      local_d14 = ROBUSTACCESS_TRUE;
      local_d18 = READWRITETYPE_WRITE;
      local_d1c = SHADERTYPE_VERT_AND_FRAG;
      local_d20 = RESOURCETYPE_LOCAL_ARRAY;
      local_d24 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 10,&local_bd8,&local_bf8,&local_d14,
                 &local_d18,&local_d1c,&local_d20,&local_d24);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c18,"compute",&local_102f)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c38,"Provoke a context reset in compute shader and ",&local_1030);
      local_d28 = ROBUSTACCESS_TRUE;
      local_d2c = READWRITETYPE_WRITE;
      local_d34 = RESOURCETYPE_LOCAL_ARRAY;
      local_d38 = READWRITETYPE_READ;
      local_d30 = local_d34;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0xb,&local_c18,&local_c38,&local_d28
                 ,&local_d2c,&local_d30,&local_d34,&local_d38);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d8,"vertex",&local_1031);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9f8,"Provoke a context reset in vertex shader and ",&local_1032);
      local_d40 = READWRITETYPE_WRITE;
      local_d44 = SHADERTYPE_VERT;
      local_d48 = RESOURCETYPE_UBO;
      local_d4c = READWRITETYPE_READ;
      local_d3c = local_d40;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0xc,&local_9d8,&local_9f8,&local_d3c
                 ,&local_d40,&local_d44,&local_d48,&local_d4c);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a18,"fragment",&local_1033);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a38,"Provoke a context reset in fragment shader and ",&local_1034)
      ;
      local_d58 = READWRITETYPE_WRITE;
      local_d5c = RESOURCETYPE_UBO;
      local_d60 = READWRITETYPE_READ;
      local_d54 = local_d58;
      local_d50 = local_d58;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0xd,&local_a18,&local_a38,&local_d50
                 ,&local_d54,&local_d58,&local_d5c,&local_d60);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_758,"vertex_and_fragment",&local_1035);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_778,"Provoke a context reset in vertex and fragment shader and ",
                 &local_1036);
      local_d68 = READWRITETYPE_WRITE;
      local_d6c = SHADERTYPE_VERT_AND_FRAG;
      local_d70 = RESOURCETYPE_UBO;
      local_d74 = READWRITETYPE_READ;
      local_d64 = local_d68;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0xe,&local_758,&local_778,&local_d64
                 ,&local_d68,&local_d6c,&local_d70,&local_d74);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_798,"compute",&local_1037)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7b8,"Provoke a context reset in compute shader and ",&local_1038);
      local_d7c = READWRITETYPE_WRITE;
      local_d80 = SHADERTYPE_COMPUTE;
      local_d84 = RESOURCETYPE_UBO;
      local_d88 = READWRITETYPE_READ;
      local_d78 = local_d7c;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0xf,&local_798,&local_7b8,&local_d78
                 ,&local_d7c,&local_d80,&local_d84,&local_d88);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_7d8,"vertex",&local_1039);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7f8,"Provoke a context reset in vertex shader and ",&local_103a);
      local_d98 = READWRITETYPE_WRITE;
      local_d94 = SHADERTYPE_VERT;
      local_d9c = READWRITETYPE_READ;
      local_d90 = local_d98;
      local_d8c = local_d98;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x10,&local_7d8,&local_7f8,
                 &local_d8c,&local_d90,&local_d94,&local_d98,&local_d9c);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_818,"fragment",&local_103b);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_838,"Provoke a context reset in fragment shader and ",&local_103c)
      ;
      local_dac = READWRITETYPE_WRITE;
      local_db0 = READWRITETYPE_READ;
      local_da8 = local_dac;
      local_da4 = local_dac;
      local_da0 = local_dac;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x11,&local_818,&local_838,
                 &local_da0,&local_da4,&local_da8,&local_dac,&local_db0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_858,"vertex_and_fragment",&local_103d);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_878,"Provoke a context reset in vertex and fragment shader and ",
                 &local_103e);
      local_dc0 = READWRITETYPE_WRITE;
      local_dbc = SHADERTYPE_VERT_AND_FRAG;
      local_dc4 = READWRITETYPE_READ;
      local_db8 = local_dc0;
      local_db4 = local_dc0;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x12,&local_858,&local_878,
                 &local_db4,&local_db8,&local_dbc,&local_dc0,&local_dc4);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_898,"compute",&local_103f)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8b8,"Provoke a context reset in compute shader and ",&local_1040);
      local_dd4 = READWRITETYPE_WRITE;
      local_dd0 = SHADERTYPE_COMPUTE;
      local_dd8 = READWRITETYPE_READ;
      local_dcc = local_dd4;
      local_dc8 = local_dd4;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x13,&local_898,&local_8b8,
                 &local_dc8,&local_dcc,&local_dd0,&local_dd4,&local_dd8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,"vertex",&local_1041);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8f8,"Provoke a context reset in vertex shader and ",&local_1042);
      local_de0 = READWRITETYPE_WRITE;
      local_de4 = SHADERTYPE_VERT;
      local_de8 = RESOURCETYPE_LOCAL_ARRAY;
      local_dec = READWRITETYPE_READ;
      local_ddc = local_de0;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x14,&local_8d8,&local_8f8,
                 &local_ddc,&local_de0,&local_de4,&local_de8,&local_dec);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_918,"fragment",&local_1043);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_938,"Provoke a context reset in fragment shader and ",&local_1044)
      ;
      local_df8 = READWRITETYPE_WRITE;
      local_dfc = RESOURCETYPE_LOCAL_ARRAY;
      local_e00 = READWRITETYPE_READ;
      local_df4 = local_df8;
      local_df0 = local_df8;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x15,&local_918,&local_938,
                 &local_df0,&local_df4,&local_df8,&local_dfc,&local_e00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_958,"vertex_and_fragment",&local_1045);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_978,"Provoke a context reset in vertex and fragment shader and ",
                 &local_1046);
      local_e08 = READWRITETYPE_WRITE;
      local_e0c = SHADERTYPE_VERT_AND_FRAG;
      local_e10 = RESOURCETYPE_LOCAL_ARRAY;
      local_e14 = READWRITETYPE_READ;
      local_e04 = local_e08;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x16,&local_958,&local_978,
                 &local_e04,&local_e08,&local_e0c,&local_e10,&local_e14);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_998,"compute",&local_1047)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9b8,"Provoke a context reset in compute shader and ",&local_1048);
      local_e1c = READWRITETYPE_WRITE;
      local_e24 = RESOURCETYPE_LOCAL_ARRAY;
      local_e28 = READWRITETYPE_READ;
      local_e20 = local_e24;
      local_e18 = local_e1c;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x17,&local_998,&local_9b8,
                 &local_e18,&local_e1c,&local_e20,&local_e24,&local_e28);
      std::__cxx11::string::~string((string *)&local_9b8);
      std::__cxx11::string::~string((string *)&local_998);
      std::__cxx11::string::~string((string *)&local_978);
      std::__cxx11::string::~string((string *)&local_958);
      std::__cxx11::string::~string((string *)&local_938);
      std::__cxx11::string::~string((string *)&local_918);
      std::__cxx11::string::~string((string *)&local_8f8);
      std::__cxx11::string::~string((string *)&local_8d8);
      std::__cxx11::string::~string((string *)&local_8b8);
      std::__cxx11::string::~string((string *)&local_898);
      std::__cxx11::string::~string((string *)&local_878);
      std::__cxx11::string::~string((string *)&local_858);
      std::__cxx11::string::~string((string *)&local_838);
      std::__cxx11::string::~string((string *)&local_818);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_7d8);
      std::__cxx11::string::~string((string *)&local_7b8);
      std::__cxx11::string::~string((string *)&local_798);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_a38);
      std::__cxx11::string::~string((string *)&local_a18);
      std::__cxx11::string::~string((string *)&local_9f8);
      std::__cxx11::string::~string((string *)&local_9d8);
      std::__cxx11::string::~string((string *)&local_c38);
      std::__cxx11::string::~string((string *)&local_c18);
      std::__cxx11::string::~string((string *)&local_bf8);
      std::__cxx11::string::~string((string *)&local_bd8);
      std::__cxx11::string::~string((string *)&local_bb8);
      std::__cxx11::string::~string((string *)&local_b98);
      std::__cxx11::string::~string((string *)&local_b78);
      std::__cxx11::string::~string((string *)&local_b58);
      std::__cxx11::string::~string((string *)&local_b38);
      std::__cxx11::string::~string((string *)&local_b18);
      std::__cxx11::string::~string((string *)&local_af8);
      std::__cxx11::string::~string((string *)&local_ad8);
      std::__cxx11::string::~string((string *)&local_ab8);
      std::__cxx11::string::~string((string *)&local_a98);
      std::__cxx11::string::~string((string *)&local_a78);
      std::__cxx11::string::~string((string *)&local_a58);
      std::__cxx11::string::~string((string *)&local_f08);
      std::__cxx11::string::~string((string *)&local_ee8);
      std::__cxx11::string::~string((string *)&local_ec8);
      std::__cxx11::string::~string((string *)&local_ea8);
      std::__cxx11::string::~string((string *)&local_e88);
      std::__cxx11::string::~string((string *)&local_e68);
      std::__cxx11::string::~string((string *)&local_1008);
      std::__cxx11::string::~string((string *)&local_fc8);
      __cxa_atexit(__cxx_global_array_dtor_49,0,&__dso_handle);
      __cxa_guard_release(&createRobustnessTests(deqp::egl::EglTestContext&)::s_outOfBoundReadCases)
      ;
    }
  }
  lVar14 = 0x18;
  pPVar13 = createRobustnessTests::s_outOfBoundReadCases;
  while( true ) {
    bVar15 = lVar14 == 0;
    lVar14 = lVar14 + -1;
    if (bVar15) break;
    RVar4 = pPVar13->m_resourceType;
    if (RVar4 == RESOURCETYPE_UBO) {
      RVar5 = pPVar13->m_robustAccessType;
      if (RVar5 == ROBUSTACCESS_TRUE) {
        pTVar9 = (TestNode *)operator_new(0xf8);
        pcVar1 = (pPVar13->m_name)._M_dataplus._M_p;
        std::operator+(&local_fc8.m_name,&pPVar13->m_description,&resetScenarioDescription);
        _Var3._M_p = local_fc8.m_name._M_dataplus._M_p;
        anon_unknown_1::RobustnessTestCase::Params::Params(&local_88,pPVar13);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar9,eglTestCtx,pcVar1,_Var3._M_p,&local_88);
        tcu::TestNode::addChild((TestNode *)local_fe0,pTVar9);
        anon_unknown_1::RobustnessTestCase::Params::~Params(&local_88);
        std::__cxx11::string::~string((string *)&local_fc8);
        RVar4 = pPVar13->m_resourceType;
        if (RVar4 != RESOURCETYPE_UBO) goto LAB_00de4507;
        RVar5 = pPVar13->m_robustAccessType;
      }
      if (RVar5 == ROBUSTACCESS_FALSE) {
        pTVar9 = (TestNode *)operator_new(0xf8);
        pcVar1 = (pPVar13->m_name)._M_dataplus._M_p;
        std::operator+(&local_fc8.m_name,&pPVar13->m_description,&resetScenarioDescription);
        _Var3._M_p = local_fc8.m_name._M_dataplus._M_p;
        anon_unknown_1::RobustnessTestCase::Params::Params(&local_e0,pPVar13);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar9,eglTestCtx,pcVar1,_Var3._M_p,&local_e0);
        tcu::TestNode::addChild((TestNode *)local_fd0,pTVar9);
        anon_unknown_1::RobustnessTestCase::Params::~Params(&local_e0);
        std::__cxx11::string::~string((string *)&local_fc8);
        RVar4 = pPVar13->m_resourceType;
        goto LAB_00de4507;
      }
    }
    else {
LAB_00de4507:
      if (RVar4 == RESOURCETYPE_SSBO) {
        if (pPVar13->m_robustAccessType == ROBUSTACCESS_TRUE) {
          pTVar9 = (TestNode *)operator_new(0xf8);
          pcVar1 = (pPVar13->m_name)._M_dataplus._M_p;
          std::operator+(&local_fc8.m_name,&pPVar13->m_description,&resetScenarioDescription);
          _Var3._M_p = local_fc8.m_name._M_dataplus._M_p;
          anon_unknown_1::RobustnessTestCase::Params::Params(&local_138,pPVar13);
          anon_unknown_1::BasicResetCase::BasicResetCase
                    ((BasicResetCase *)pTVar9,eglTestCtx,pcVar1,_Var3._M_p,&local_138);
          tcu::TestNode::addChild((TestNode *)local_1010,pTVar9);
          anon_unknown_1::RobustnessTestCase::Params::~Params(&local_138);
          std::__cxx11::string::~string((string *)&local_fc8);
          RVar4 = pPVar13->m_resourceType;
          if (RVar4 != RESOURCETYPE_SSBO) goto LAB_00de4649;
        }
        if (pPVar13->m_robustAccessType != ROBUSTACCESS_FALSE) goto LAB_00de483b;
        pTVar9 = (TestNode *)operator_new(0xf8);
        pcVar1 = (pPVar13->m_name)._M_dataplus._M_p;
        std::operator+(&local_fc8.m_name,&pPVar13->m_description,&resetScenarioDescription);
        _Var3._M_p = local_fc8.m_name._M_dataplus._M_p;
        anon_unknown_1::RobustnessTestCase::Params::Params(&local_190,pPVar13);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar9,eglTestCtx,pcVar1,_Var3._M_p,&local_190);
        tcu::TestNode::addChild((TestNode *)local_1018,pTVar9);
        anon_unknown_1::RobustnessTestCase::Params::~Params(&local_190);
        std::__cxx11::string::~string((string *)&local_fc8);
        RVar4 = pPVar13->m_resourceType;
      }
LAB_00de4649:
      if (RVar4 == RESOURCETYPE_LOCAL_ARRAY) {
        if (pPVar13->m_robustAccessType == ROBUSTACCESS_TRUE) {
          pTVar9 = (TestNode *)operator_new(0xf8);
          pcVar1 = (pPVar13->m_name)._M_dataplus._M_p;
          std::operator+(&local_fc8.m_name,&pPVar13->m_description,&resetScenarioDescription);
          _Var3._M_p = local_fc8.m_name._M_dataplus._M_p;
          anon_unknown_1::RobustnessTestCase::Params::Params(&local_1e8,pPVar13);
          anon_unknown_1::BasicResetCase::BasicResetCase
                    ((BasicResetCase *)pTVar9,eglTestCtx,pcVar1,_Var3._M_p,&local_1e8);
          tcu::TestNode::addChild((TestNode *)local_f20,pTVar9);
          anon_unknown_1::RobustnessTestCase::Params::~Params(&local_1e8);
          std::__cxx11::string::~string((string *)&local_fc8);
          if (pPVar13->m_resourceType != RESOURCETYPE_LOCAL_ARRAY) goto LAB_00de483b;
        }
        if (pPVar13->m_robustAccessType == ROBUSTACCESS_FALSE) {
          pTVar9 = (TestNode *)operator_new(0xf8);
          pcVar1 = (pPVar13->m_name)._M_dataplus._M_p;
          std::operator+(&local_fc8.m_name,&pPVar13->m_description,&resetScenarioDescription);
          _Var3._M_p = local_fc8.m_name._M_dataplus._M_p;
          anon_unknown_1::RobustnessTestCase::Params::Params(&local_240,pPVar13);
          anon_unknown_1::BasicResetCase::BasicResetCase
                    ((BasicResetCase *)pTVar9,eglTestCtx,pcVar1,_Var3._M_p,&local_240);
          tcu::TestNode::addChild((TestNode *)local_f10,pTVar9);
          anon_unknown_1::RobustnessTestCase::Params::~Params(&local_240);
          std::__cxx11::string::~string((string *)&local_fc8);
        }
      }
    }
LAB_00de483b:
    pPVar13 = pPVar13 + 1;
  }
  if (createRobustnessTests(deqp::egl::EglTestContext&)::s_outOfBoundWriteCases == '\0') {
    iVar6 = __cxa_guard_acquire(&createRobustnessTests(deqp::egl::EglTestContext&)::
                                 s_outOfBoundWriteCases);
    if (iVar6 != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_fc8,"vertex",&local_1019);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1008,"Provoke a context reset in vertex shader and ",&local_101a);
      local_c4c = ROBUSTACCESS_TRUE;
      local_c54 = SHADERTYPE_VERT;
      local_c58 = RESOURCETYPE_UBO;
      local_c5c = READWRITETYPE_WRITE;
      local_c50 = local_c5c;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases,&local_fc8.m_name,&local_1008,
                 &local_c4c,&local_c50,&local_c54,&local_c58,&local_c5c);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e68,"fragment",&local_101b);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e88,"Provoke a context reset in fragment shader and ",&local_101c)
      ;
      local_c60 = ROBUSTACCESS_TRUE;
      local_c70 = READWRITETYPE_WRITE;
      local_c6c = RESOURCETYPE_UBO;
      local_c68 = local_c70;
      local_c64 = local_c70;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 1,&local_e68,&local_e88,&local_c60,
                 &local_c64,&local_c68,&local_c6c,&local_c70);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ea8,"vertex_and_fragment",&local_101d);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ec8,"Provoke a context reset in vertex and fragment shader and ",
                 &local_101e);
      local_c74 = ROBUSTACCESS_TRUE;
      local_c84 = READWRITETYPE_WRITE;
      local_c80 = RESOURCETYPE_UBO;
      local_c7c = SHADERTYPE_VERT_AND_FRAG;
      local_c78 = local_c84;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 2,&local_ea8,&local_ec8,&local_c74,
                 &local_c78,&local_c7c,&local_c80,&local_c84);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ee8,"compute",&local_101f)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f08,"Provoke a context reset in compute shader and ",&local_1020);
      local_c88 = ROBUSTACCESS_TRUE;
      local_c98 = READWRITETYPE_WRITE;
      local_c94 = RESOURCETYPE_UBO;
      local_c90 = SHADERTYPE_COMPUTE;
      local_c8c = local_c98;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 3,&local_ee8,&local_f08,&local_c88,
                 &local_c8c,&local_c90,&local_c94,&local_c98);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a58,"vertex",&local_1021);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a78,"Provoke a context reset in vertex shader and ",&local_1022);
      local_c9c = ROBUSTACCESS_TRUE;
      local_cac = READWRITETYPE_WRITE;
      local_ca4 = SHADERTYPE_VERT;
      local_ca8 = local_cac;
      local_ca0 = local_cac;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 4,&local_a58,&local_a78,&local_c9c,
                 &local_ca0,&local_ca4,&local_ca8,&local_cac);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a98,"fragment",&local_1023);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ab8,"Provoke a context reset in fragment shader and ",&local_1024)
      ;
      local_cb0 = ROBUSTACCESS_TRUE;
      local_cc0 = READWRITETYPE_WRITE;
      local_cbc = local_cc0;
      local_cb8 = local_cc0;
      local_cb4 = local_cc0;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 5,&local_a98,&local_ab8,&local_cb0,
                 &local_cb4,&local_cb8,&local_cbc,&local_cc0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ad8,"vertex_and_fragment",&local_1025);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_af8,"Provoke a context reset in vertex and fragment shader and ",
                 &local_1026);
      local_cc4 = ROBUSTACCESS_TRUE;
      local_cd4 = READWRITETYPE_WRITE;
      local_ccc = SHADERTYPE_VERT_AND_FRAG;
      local_cd0 = local_cd4;
      local_cc8 = local_cd4;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 6,&local_ad8,&local_af8,&local_cc4,
                 &local_cc8,&local_ccc,&local_cd0,&local_cd4);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b18,"compute",&local_1027)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b38,"Provoke a context reset in compute shader and ",&local_1028);
      local_cd8 = ROBUSTACCESS_TRUE;
      local_ce8 = READWRITETYPE_WRITE;
      local_ce0 = SHADERTYPE_COMPUTE;
      local_ce4 = local_ce8;
      local_cdc = local_ce8;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 7,&local_b18,&local_b38,&local_cd8,
                 &local_cdc,&local_ce0,&local_ce4,&local_ce8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b58,"vertex",&local_1029);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b78,"Provoke a context reset in vertex shader and ",&local_102a);
      local_cec = ROBUSTACCESS_TRUE;
      local_cfc = READWRITETYPE_WRITE;
      local_cf4 = SHADERTYPE_VERT;
      local_cf8 = RESOURCETYPE_LOCAL_ARRAY;
      local_cf0 = local_cfc;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 8,&local_b58,&local_b78,&local_cec,
                 &local_cf0,&local_cf4,&local_cf8,&local_cfc);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b98,"fragment",&local_102b);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_bb8,"Provoke a context reset in fragment shader and ",&local_102c)
      ;
      local_d00 = ROBUSTACCESS_TRUE;
      local_d10 = READWRITETYPE_WRITE;
      local_d0c = RESOURCETYPE_LOCAL_ARRAY;
      local_d08 = local_d10;
      local_d04 = local_d10;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 9,&local_b98,&local_bb8,&local_d00,
                 &local_d04,&local_d08,&local_d0c,&local_d10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_bd8,"vertex_and_fragment",&local_102d);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_bf8,"Provoke a context reset in vertex and fragment shader and ",
                 &local_102e);
      local_d14 = ROBUSTACCESS_TRUE;
      local_d24 = READWRITETYPE_WRITE;
      local_d1c = SHADERTYPE_VERT_AND_FRAG;
      local_d20 = RESOURCETYPE_LOCAL_ARRAY;
      local_d18 = local_d24;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 10,&local_bd8,&local_bf8,&local_d14
                 ,&local_d18,&local_d1c,&local_d20,&local_d24);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c18,"compute",&local_102f)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c38,"Provoke a context reset in compute shader and ",&local_1030);
      local_d28 = ROBUSTACCESS_TRUE;
      local_d38 = READWRITETYPE_WRITE;
      local_d34 = RESOURCETYPE_LOCAL_ARRAY;
      local_d30 = local_d34;
      local_d2c = local_d38;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0xb,&local_c18,&local_c38,
                 &local_d28,&local_d2c,&local_d30,&local_d34,&local_d38);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d8,"vertex",&local_1031);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9f8,"Provoke a context reset in vertex shader and ",&local_1032);
      local_d4c = READWRITETYPE_WRITE;
      local_d44 = SHADERTYPE_VERT;
      local_d48 = RESOURCETYPE_UBO;
      local_d40 = local_d4c;
      local_d3c = local_d4c;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0xc,&local_9d8,&local_9f8,
                 &local_d3c,&local_d40,&local_d44,&local_d48,&local_d4c);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a18,"fragment",&local_1033);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a38,"Provoke a context reset in fragment shader and ",&local_1034)
      ;
      local_d60 = READWRITETYPE_WRITE;
      local_d5c = RESOURCETYPE_UBO;
      local_d58 = local_d60;
      local_d54 = local_d60;
      local_d50 = local_d60;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0xd,&local_a18,&local_a38,
                 &local_d50,&local_d54,&local_d58,&local_d5c,&local_d60);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_758,"vertex_and_fragment",&local_1035);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_778,"Provoke a context reset in vertex and fragment shader and ",
                 &local_1036);
      local_d74 = READWRITETYPE_WRITE;
      local_d70 = RESOURCETYPE_UBO;
      local_d6c = SHADERTYPE_VERT_AND_FRAG;
      local_d68 = local_d74;
      local_d64 = local_d74;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0xe,&local_758,&local_778,
                 &local_d64,&local_d68,&local_d6c,&local_d70,&local_d74);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_798,"compute",&local_1037)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7b8,"Provoke a context reset in compute shader and ",&local_1038);
      local_d88 = READWRITETYPE_WRITE;
      local_d84 = RESOURCETYPE_UBO;
      local_d80 = SHADERTYPE_COMPUTE;
      local_d7c = local_d88;
      local_d78 = local_d88;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0xf,&local_798,&local_7b8,
                 &local_d78,&local_d7c,&local_d80,&local_d84,&local_d88);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_7d8,"vertex",&local_1039);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7f8,"Provoke a context reset in vertex shader and ",&local_103a);
      local_d9c = READWRITETYPE_WRITE;
      local_d94 = SHADERTYPE_VERT;
      local_d98 = local_d9c;
      local_d90 = local_d9c;
      local_d8c = local_d9c;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x10,&local_7d8,&local_7f8,
                 &local_d8c,&local_d90,&local_d94,&local_d98,&local_d9c);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_818,"fragment",&local_103b);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_838,"Provoke a context reset in fragment shader and ",&local_103c)
      ;
      local_db0 = READWRITETYPE_WRITE;
      local_dac = local_db0;
      local_da8 = local_db0;
      local_da4 = local_db0;
      local_da0 = local_db0;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x11,&local_818,&local_838,
                 &local_da0,&local_da4,&local_da8,&local_dac,&local_db0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_858,"vertex_and_fragment",&local_103d);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_878,"Provoke a context reset in vertex and fragment shader and ",
                 &local_103e);
      local_dc4 = READWRITETYPE_WRITE;
      local_dbc = SHADERTYPE_VERT_AND_FRAG;
      local_dc0 = local_dc4;
      local_db8 = local_dc4;
      local_db4 = local_dc4;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x12,&local_858,&local_878,
                 &local_db4,&local_db8,&local_dbc,&local_dc0,&local_dc4);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_898,"compute",&local_103f)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8b8,"Provoke a context reset in compute shader and ",&local_1040);
      local_dd8 = READWRITETYPE_WRITE;
      local_dd0 = SHADERTYPE_COMPUTE;
      local_dd4 = local_dd8;
      local_dcc = local_dd8;
      local_dc8 = local_dd8;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x13,&local_898,&local_8b8,
                 &local_dc8,&local_dcc,&local_dd0,&local_dd4,&local_dd8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,"vertex",&local_1041);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8f8,"Provoke a context reset in vertex shader and ",&local_1042);
      local_dec = READWRITETYPE_WRITE;
      local_de4 = SHADERTYPE_VERT;
      local_de8 = RESOURCETYPE_LOCAL_ARRAY;
      local_de0 = local_dec;
      local_ddc = local_dec;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x14,&local_8d8,&local_8f8,
                 &local_ddc,&local_de0,&local_de4,&local_de8,&local_dec);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_918,"fragment",&local_1043);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_938,"Provoke a context reset in fragment shader and ",&local_1044)
      ;
      local_e00 = READWRITETYPE_WRITE;
      local_dfc = RESOURCETYPE_LOCAL_ARRAY;
      local_df8 = local_e00;
      local_df4 = local_e00;
      local_df0 = local_e00;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x15,&local_918,&local_938,
                 &local_df0,&local_df4,&local_df8,&local_dfc,&local_e00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_958,"vertex_and_fragment",&local_1045);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_978,"Provoke a context reset in vertex and fragment shader and ",
                 &local_1046);
      local_e14 = READWRITETYPE_WRITE;
      local_e0c = SHADERTYPE_VERT_AND_FRAG;
      local_e10 = RESOURCETYPE_LOCAL_ARRAY;
      local_e08 = local_e14;
      local_e04 = local_e14;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x16,&local_958,&local_978,
                 &local_e04,&local_e08,&local_e0c,&local_e10,&local_e14);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_998,"compute",&local_1047)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9b8,"Provoke a context reset in compute shader and ",&local_1048);
      local_e28 = READWRITETYPE_WRITE;
      local_e24 = RESOURCETYPE_LOCAL_ARRAY;
      local_e20 = local_e24;
      local_e1c = local_e28;
      local_e18 = local_e28;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x17,&local_998,&local_9b8,
                 &local_e18,&local_e1c,&local_e20,&local_e24,&local_e28);
      std::__cxx11::string::~string((string *)&local_9b8);
      std::__cxx11::string::~string((string *)&local_998);
      std::__cxx11::string::~string((string *)&local_978);
      std::__cxx11::string::~string((string *)&local_958);
      std::__cxx11::string::~string((string *)&local_938);
      std::__cxx11::string::~string((string *)&local_918);
      std::__cxx11::string::~string((string *)&local_8f8);
      std::__cxx11::string::~string((string *)&local_8d8);
      std::__cxx11::string::~string((string *)&local_8b8);
      std::__cxx11::string::~string((string *)&local_898);
      std::__cxx11::string::~string((string *)&local_878);
      std::__cxx11::string::~string((string *)&local_858);
      std::__cxx11::string::~string((string *)&local_838);
      std::__cxx11::string::~string((string *)&local_818);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_7d8);
      std::__cxx11::string::~string((string *)&local_7b8);
      std::__cxx11::string::~string((string *)&local_798);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_a38);
      std::__cxx11::string::~string((string *)&local_a18);
      std::__cxx11::string::~string((string *)&local_9f8);
      std::__cxx11::string::~string((string *)&local_9d8);
      std::__cxx11::string::~string((string *)&local_c38);
      std::__cxx11::string::~string((string *)&local_c18);
      std::__cxx11::string::~string((string *)&local_bf8);
      std::__cxx11::string::~string((string *)&local_bd8);
      std::__cxx11::string::~string((string *)&local_bb8);
      std::__cxx11::string::~string((string *)&local_b98);
      std::__cxx11::string::~string((string *)&local_b78);
      std::__cxx11::string::~string((string *)&local_b58);
      std::__cxx11::string::~string((string *)&local_b38);
      std::__cxx11::string::~string((string *)&local_b18);
      std::__cxx11::string::~string((string *)&local_af8);
      std::__cxx11::string::~string((string *)&local_ad8);
      std::__cxx11::string::~string((string *)&local_ab8);
      std::__cxx11::string::~string((string *)&local_a98);
      std::__cxx11::string::~string((string *)&local_a78);
      std::__cxx11::string::~string((string *)&local_a58);
      std::__cxx11::string::~string((string *)&local_f08);
      std::__cxx11::string::~string((string *)&local_ee8);
      std::__cxx11::string::~string((string *)&local_ec8);
      std::__cxx11::string::~string((string *)&local_ea8);
      std::__cxx11::string::~string((string *)&local_e88);
      std::__cxx11::string::~string((string *)&local_e68);
      std::__cxx11::string::~string((string *)&local_1008);
      std::__cxx11::string::~string((string *)&local_fc8);
      __cxa_atexit(__cxx_global_array_dtor_50,0,&__dso_handle);
      __cxa_guard_release(&createRobustnessTests(deqp::egl::EglTestContext&)::s_outOfBoundWriteCases
                         );
    }
  }
  lVar14 = 0x18;
  pPVar13 = createRobustnessTests::s_outOfBoundWriteCases;
  do {
    bVar15 = lVar14 == 0;
    lVar14 = lVar14 + -1;
    if (bVar15) {
      pTVar11 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup(pTVar11,eglTestCtx,"reads","Out of bounds read accesses");
      pTVar8 = local_fe8;
      pTVar12 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup(pTVar12,eglTestCtx,"writes","Out of bounds write accesses");
      tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)local_fe0);
      tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)local_1010);
      tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)local_f20);
      tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)pTVar8);
      tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)local_f58);
      tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)local_f28);
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar8,eglTestCtx,"reset_status",
                 "Tests that query the reset status after a context reset has occurred");
      tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)pTVar11);
      tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)pTVar12);
      tcu::TestNode::addChild((TestNode *)local_f38,(TestNode *)pTVar8);
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup(pTVar8,eglTestCtx,"reads","Out of bounds read accesses");
      pTVar11 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup(pTVar11,eglTestCtx,"writes","Out of bounds write accesses");
      tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)local_fd0);
      tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)local_1018);
      tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)local_f10);
      tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)local_fd8);
      tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)this);
      tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)local_f18);
      pTVar12 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar12,eglTestCtx,"reset_status",
                 "Tests that query the reset status after a context reset has occurred");
      tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)pTVar8);
      tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)pTVar11);
      tcu::TestNode::addChild((TestNode *)local_f40,(TestNode *)pTVar12);
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar8,eglTestCtx,"reset_status",
                 "Tests that query the reset status after a context reset has occurred");
      pTVar11 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar11,eglTestCtx,"reset_status",
                 "Tests that query the reset status after a context reset has occurred");
      local_1018 = pTVar8;
      if (createRobustnessTests(deqp::egl::EglTestContext&)::s_fixedFunctionPipelineCases == '\0') {
        iVar6 = __cxa_guard_acquire(&createRobustnessTests(deqp::egl::EglTestContext&)::
                                     s_fixedFunctionPipelineCases);
        if (iVar6 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_fc8,"index_buffer_out_of_bounds",(allocator<char> *)&local_bd8
                    );
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1008,
                     "Provoke context reset and query error states and reset notifications",
                     (allocator<char> *)&local_bf8);
          local_a58._M_dataplus._M_p._0_4_ = 0;
          local_a78._M_dataplus._M_p._0_4_ = 2;
          local_a98._M_dataplus._M_p._0_4_ = 0;
          anon_unknown_1::RobustnessTestCase::Params::Params
                    (createRobustnessTests::s_fixedFunctionPipelineCases,&local_fc8.m_name,
                     &local_1008,(RobustAccessType *)&local_a58,(ContextResetType *)&local_a78,
                     (FixedFunctionType *)&local_a98);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e68,"vertex_buffer_out_of_bounds",
                     (allocator<char> *)&local_c18);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e88,
                     "Provoke context reset and query error states and reset notifications",
                     (allocator<char> *)&local_c38);
          local_ab8._M_dataplus._M_p._0_4_ = 0;
          local_ad8._M_dataplus._M_p._0_4_ = 2;
          local_af8._M_dataplus._M_p._0_4_ = 1;
          anon_unknown_1::RobustnessTestCase::Params::Params
                    (createRobustnessTests::s_fixedFunctionPipelineCases + 1,&local_e68,&local_e88,
                     (RobustAccessType *)&local_ab8,(ContextResetType *)&local_ad8,
                     (FixedFunctionType *)&local_af8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ea8,"index_buffer_out_of_bounds",(allocator<char> *)&local_9d8
                    );
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ec8,
                     "Provoke context reset and query error states and reset notifications",
                     (allocator<char> *)&local_9f8);
          local_b18._M_dataplus._M_p._0_4_ = 1;
          local_b38._M_dataplus._M_p._0_4_ = 2;
          local_b58._M_dataplus._M_p._0_4_ = 0;
          anon_unknown_1::RobustnessTestCase::Params::Params
                    (createRobustnessTests::s_fixedFunctionPipelineCases + 2,&local_ea8,&local_ec8,
                     (RobustAccessType *)&local_b18,(ContextResetType *)&local_b38,
                     (FixedFunctionType *)&local_b58);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ee8,"vertex_buffer_out_of_bounds",
                     (allocator<char> *)&local_a18);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f08,
                     "Provoke context reset and query error states and reset notifications",
                     (allocator<char> *)&local_a38);
          local_bb8._M_dataplus._M_p._0_4_ = 1;
          local_b98._M_dataplus._M_p._0_4_ = 2;
          local_b78._M_dataplus._M_p._0_4_ = local_bb8._M_dataplus._M_p._0_4_;
          anon_unknown_1::RobustnessTestCase::Params::Params
                    (createRobustnessTests::s_fixedFunctionPipelineCases + 3,&local_ee8,&local_f08,
                     (RobustAccessType *)&local_b78,(ContextResetType *)&local_b98,
                     (FixedFunctionType *)&local_bb8);
          std::__cxx11::string::~string((string *)&local_f08);
          std::__cxx11::string::~string((string *)&local_ee8);
          std::__cxx11::string::~string((string *)&local_ec8);
          std::__cxx11::string::~string((string *)&local_ea8);
          std::__cxx11::string::~string((string *)&local_e88);
          std::__cxx11::string::~string((string *)&local_e68);
          std::__cxx11::string::~string((string *)&local_1008);
          std::__cxx11::string::~string((string *)&local_fc8);
          __cxa_atexit(__cxx_global_array_dtor_58,0,&__dso_handle);
          __cxa_guard_release(&createRobustnessTests(deqp::egl::EglTestContext&)::
                               s_fixedFunctionPipelineCases);
        }
      }
      for (lVar14 = 0; lVar14 != 0x160; lVar14 = lVar14 + 0x58) {
        pPVar13 = (Params *)
                  ((long)&createRobustnessTests::s_fixedFunctionPipelineCases[0].m_name._M_dataplus.
                          _M_p + lVar14);
        if (*(int *)((long)&createRobustnessTests::s_fixedFunctionPipelineCases[0].
                            m_robustAccessType + lVar14) == 0) {
          pTVar9 = (TestNode *)operator_new(0xf8);
          pcVar1 = *(char **)((long)&createRobustnessTests::s_fixedFunctionPipelineCases[0].m_name.
                                     _M_dataplus._M_p + lVar14);
          pcVar2 = *(char **)((long)&createRobustnessTests::s_fixedFunctionPipelineCases[0].
                                     m_description._M_dataplus._M_p + lVar14);
          this_00 = &local_4a8;
          anon_unknown_1::RobustnessTestCase::Params::Params(this_00,pPVar13);
          anon_unknown_1::BasicResetCase::BasicResetCase
                    ((BasicResetCase *)pTVar9,eglTestCtx,pcVar1,pcVar2,this_00);
          tcu::TestNode::addChild((TestNode *)local_1018,pTVar9);
        }
        else {
          pTVar9 = (TestNode *)operator_new(0xf8);
          pcVar1 = *(char **)((long)&createRobustnessTests::s_fixedFunctionPipelineCases[0].m_name.
                                     _M_dataplus._M_p + lVar14);
          pcVar2 = *(char **)((long)&createRobustnessTests::s_fixedFunctionPipelineCases[0].
                                     m_description._M_dataplus._M_p + lVar14);
          anon_unknown_1::RobustnessTestCase::Params::Params(&local_6b8,pPVar13);
          anon_unknown_1::BasicResetCase::BasicResetCase
                    ((BasicResetCase *)pTVar9,eglTestCtx,pcVar1,pcVar2,&local_6b8);
          tcu::TestNode::addChild((TestNode *)pTVar11,pTVar9);
          this_00 = &local_6b8;
        }
        anon_unknown_1::RobustnessTestCase::Params::~Params(this_00);
      }
      tcu::TestNode::addChild((TestNode *)pTVar7,(TestNode *)local_1018);
      tcu::TestNode::addChild((TestNode *)local_f48,(TestNode *)pTVar11);
      pRVar10 = (RobustnessTestCase *)operator_new(0xf8);
      anon_unknown_1::RobustnessTestCase::RobustnessTestCase
                (pRVar10,eglTestCtx,"query_robust_access",
                 "Query robust access after successfully creating a robust context");
      (pRVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__RobustnessTestCase_01e0b5a0;
      tcu::TestNode::addChild((TestNode *)local_f60,(TestNode *)pRVar10);
      pRVar10 = (RobustnessTestCase *)operator_new(0xf8);
      anon_unknown_1::RobustnessTestCase::RobustnessTestCase
                (pRVar10,eglTestCtx,"no_reset_notification",
                 "Query reset notification strategy after specifying GL_NO_RESET_NOTIFICATION");
      (pRVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__RobustnessTestCase_01e0b5f0;
      tcu::TestNode::addChild((TestNode *)local_f60,(TestNode *)pRVar10);
      pRVar10 = (RobustnessTestCase *)operator_new(0xf8);
      anon_unknown_1::RobustnessTestCase::RobustnessTestCase
                (pRVar10,eglTestCtx,"lose_context_on_reset",
                 "Query reset notification strategy after specifying GL_LOSE_CONTEXT_ON_RESET");
      (pRVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__RobustnessTestCase_01e0b640;
      tcu::TestNode::addChild((TestNode *)local_f60,(TestNode *)pRVar10);
      pRVar10 = (RobustnessTestCase *)operator_new(0xf8);
      anon_unknown_1::RobustnessTestCase::RobustnessTestCase
                (pRVar10,eglTestCtx,"invalid_robust_context_creation",
                 "Create a non-robust context but specify a reset notification strategy");
      (pRVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__RobustnessTestCase_01e0b690;
      tcu::TestNode::addChild((TestNode *)local_f50,(TestNode *)pRVar10);
      pRVar10 = (RobustnessTestCase *)operator_new(0xf8);
      anon_unknown_1::RobustnessTestCase::RobustnessTestCase
                (pRVar10,eglTestCtx,"invalid_robust_shared_context_creation",
                 "Create a context share group with conflicting reset notification strategies");
      (pRVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__RobustnessTestCase_01e0b6e0;
      tcu::TestNode::addChild((TestNode *)local_f50,(TestNode *)pRVar10);
      tcu::TestNode::addChild((TestNode *)local_f68,(TestNode *)local_f30);
      tcu::TestNode::addChild((TestNode *)local_f68,(TestNode *)local_f38);
      tcu::TestNode::addChild((TestNode *)local_f68,(TestNode *)local_f40);
      tcu::TestNode::addChild((TestNode *)local_f70,(TestNode *)local_f68);
      tcu::TestNode::addChild((TestNode *)local_f70,(TestNode *)pTVar7);
      tcu::TestNode::addChild((TestNode *)local_f70,(TestNode *)local_f48);
      tcu::TestNode::addChild
                ((TestNode *)
                 group.
                 super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                 .m_data.ptr,(TestNode *)local_f60);
      tcu::TestNode::addChild
                ((TestNode *)
                 group.
                 super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                 .m_data.ptr,(TestNode *)local_f70);
      tcu::TestNode::addChild
                ((TestNode *)
                 group.
                 super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                 .m_data.ptr,(TestNode *)local_f50);
      pTVar7 = group.
               super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
               .m_data.ptr;
      group.
      super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)0x0;
      std::__cxx11::string::~string((string *)&recoverScenarioDescription);
      std::__cxx11::string::~string((string *)&sharedScenarioDescription);
      std::__cxx11::string::~string((string *)&queryScenarioDescription);
      std::__cxx11::string::~string((string *)&syncScenarioDescription);
      std::__cxx11::string::~string((string *)&resetScenarioDescription);
      de::details::
      UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
      ~UniqueBase(&group.
                   super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                 );
      return pTVar7;
    }
    RVar4 = pPVar13->m_resourceType;
    if (RVar4 == RESOURCETYPE_UBO) {
      RVar5 = pPVar13->m_robustAccessType;
      if (RVar5 == ROBUSTACCESS_TRUE) {
        pTVar9 = (TestNode *)operator_new(0xf8);
        pcVar1 = (pPVar13->m_name)._M_dataplus._M_p;
        std::operator+(&local_fc8.m_name,&pPVar13->m_description,&resetScenarioDescription);
        _Var3._M_p = local_fc8.m_name._M_dataplus._M_p;
        anon_unknown_1::RobustnessTestCase::Params::Params(&local_298,pPVar13);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar9,eglTestCtx,pcVar1,_Var3._M_p,&local_298);
        tcu::TestNode::addChild((TestNode *)local_fe8,pTVar9);
        anon_unknown_1::RobustnessTestCase::Params::~Params(&local_298);
        std::__cxx11::string::~string((string *)&local_fc8);
        RVar4 = pPVar13->m_resourceType;
        if (RVar4 != RESOURCETYPE_UBO) goto LAB_00de491b;
        RVar5 = pPVar13->m_robustAccessType;
      }
      if (RVar5 == ROBUSTACCESS_FALSE) {
        pTVar9 = (TestNode *)operator_new(0xf8);
        pcVar1 = (pPVar13->m_name)._M_dataplus._M_p;
        std::operator+(&local_fc8.m_name,&pPVar13->m_description,&resetScenarioDescription);
        _Var3._M_p = local_fc8.m_name._M_dataplus._M_p;
        anon_unknown_1::RobustnessTestCase::Params::Params(&local_2f0,pPVar13);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar9,eglTestCtx,pcVar1,_Var3._M_p,&local_2f0);
        tcu::TestNode::addChild((TestNode *)local_fd8,pTVar9);
        anon_unknown_1::RobustnessTestCase::Params::~Params(&local_2f0);
        std::__cxx11::string::~string((string *)&local_fc8);
        RVar4 = pPVar13->m_resourceType;
        goto LAB_00de491b;
      }
    }
    else {
LAB_00de491b:
      if (RVar4 == RESOURCETYPE_SSBO) {
        if (pPVar13->m_robustAccessType == ROBUSTACCESS_TRUE) {
          pTVar9 = (TestNode *)operator_new(0xf8);
          pcVar1 = (pPVar13->m_name)._M_dataplus._M_p;
          std::operator+(&local_fc8.m_name,&pPVar13->m_description,&resetScenarioDescription);
          _Var3._M_p = local_fc8.m_name._M_dataplus._M_p;
          anon_unknown_1::RobustnessTestCase::Params::Params(&local_348,pPVar13);
          anon_unknown_1::BasicResetCase::BasicResetCase
                    ((BasicResetCase *)pTVar9,eglTestCtx,pcVar1,_Var3._M_p,&local_348);
          tcu::TestNode::addChild((TestNode *)local_f58,pTVar9);
          anon_unknown_1::RobustnessTestCase::Params::~Params(&local_348);
          std::__cxx11::string::~string((string *)&local_fc8);
          RVar4 = pPVar13->m_resourceType;
          if (RVar4 != RESOURCETYPE_SSBO) goto LAB_00de4a60;
        }
        if (pPVar13->m_robustAccessType != ROBUSTACCESS_FALSE) goto LAB_00de4c52;
        pTVar9 = (TestNode *)operator_new(0xf8);
        pcVar1 = (pPVar13->m_name)._M_dataplus._M_p;
        std::operator+(&local_fc8.m_name,&pPVar13->m_description,&resetScenarioDescription);
        _Var3._M_p = local_fc8.m_name._M_dataplus._M_p;
        anon_unknown_1::RobustnessTestCase::Params::Params(&local_3a0,pPVar13);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar9,eglTestCtx,pcVar1,_Var3._M_p,&local_3a0);
        tcu::TestNode::addChild((TestNode *)this,pTVar9);
        anon_unknown_1::RobustnessTestCase::Params::~Params(&local_3a0);
        std::__cxx11::string::~string((string *)&local_fc8);
        RVar4 = pPVar13->m_resourceType;
      }
LAB_00de4a60:
      if (RVar4 == RESOURCETYPE_LOCAL_ARRAY) {
        if (pPVar13->m_robustAccessType == ROBUSTACCESS_TRUE) {
          pTVar9 = (TestNode *)operator_new(0xf8);
          pcVar1 = (pPVar13->m_name)._M_dataplus._M_p;
          std::operator+(&local_fc8.m_name,&pPVar13->m_description,&resetScenarioDescription);
          _Var3._M_p = local_fc8.m_name._M_dataplus._M_p;
          anon_unknown_1::RobustnessTestCase::Params::Params(&local_3f8,pPVar13);
          anon_unknown_1::BasicResetCase::BasicResetCase
                    ((BasicResetCase *)pTVar9,eglTestCtx,pcVar1,_Var3._M_p,&local_3f8);
          tcu::TestNode::addChild((TestNode *)local_f28,pTVar9);
          anon_unknown_1::RobustnessTestCase::Params::~Params(&local_3f8);
          std::__cxx11::string::~string((string *)&local_fc8);
          if (pPVar13->m_resourceType != RESOURCETYPE_LOCAL_ARRAY) goto LAB_00de4c52;
        }
        if (pPVar13->m_robustAccessType == ROBUSTACCESS_FALSE) {
          pTVar9 = (TestNode *)operator_new(0xf8);
          pcVar1 = (pPVar13->m_name)._M_dataplus._M_p;
          std::operator+(&local_fc8.m_name,&pPVar13->m_description,&resetScenarioDescription);
          _Var3._M_p = local_fc8.m_name._M_dataplus._M_p;
          anon_unknown_1::RobustnessTestCase::Params::Params(&local_450,pPVar13);
          anon_unknown_1::BasicResetCase::BasicResetCase
                    ((BasicResetCase *)pTVar9,eglTestCtx,pcVar1,_Var3._M_p,&local_450);
          tcu::TestNode::addChild((TestNode *)local_f18,pTVar9);
          anon_unknown_1::RobustnessTestCase::Params::~Params(&local_450);
          std::__cxx11::string::~string((string *)&local_fc8);
        }
      }
    }
LAB_00de4c52:
    pPVar13 = pPVar13 + 1;
  } while( true );
}

Assistant:

TestCaseGroup* createRobustnessTests (EglTestContext& eglTestCtx)
{
	de::MovePtr<TestCaseGroup> group (new TestCaseGroup(eglTestCtx, "robustness", "KHR_robustness tests"));

	tcu::TestCaseGroup* const contextCreationTestGroup			= new TestCaseGroup(eglTestCtx, "create_context",						"Test valid context_creation attributes");
	tcu::TestCaseGroup* const contextResetTestGroup				= new TestCaseGroup(eglTestCtx, "reset_context",						"Test context resets scenarios");
	tcu::TestCaseGroup* const negativeContextTestGroup			= new TestCaseGroup(eglTestCtx, "negative_context",						"Test invalid context creation attributes");

	tcu::TestCaseGroup* const shadersTestGroup					= new TestCaseGroup(eglTestCtx, "shaders",								"Shader specific context reset tests");
	tcu::TestCaseGroup* const fixedFunctionTestGroup			= new TestCaseGroup(eglTestCtx, "fixed_function_pipeline",				"Fixed function pipeline context reset tests with robust context");
	tcu::TestCaseGroup* const fixedFunctionNonRobustTestGroup	= new TestCaseGroup(eglTestCtx, "fixed_function_pipeline_non_robust",	"Fixed function pipeline context reset tests with non-robust context");

	tcu::TestCaseGroup* const infiniteLoopTestGroup				= new TestCaseGroup(eglTestCtx, "infinite_loop",						"Infinite loop scenarios");
	tcu::TestCaseGroup* const outOfBoundsTestGroup				= new TestCaseGroup(eglTestCtx, "out_of_bounds",						"Out of bounds access scenarios with robust context");

	tcu::TestCaseGroup* const outOfBoundsNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "out_of_bounds_non_robust",				"Out of bounds access scenarios with non-robust context");

	const string resetScenarioDescription	= "query error states and reset notifications";
	const string syncScenarioDescription	= "query sync status with getSynciv()";
	const string queryScenarioDescription	= "check availability of query result with getQueryObjectiv()";
	const string sharedScenarioDescription	= "check reset notification is propagated to shared context";
	const string recoverScenarioDescription	= "delete the old context and create a new one";

	// infinite loop test cases
	{
		tcu::TestCaseGroup* const infiniteLoopResetTestGroup	= new TestCaseGroup(eglTestCtx, "reset_status",				"Tests that query the reset status after a context reset has occurred");
		tcu::TestCaseGroup* const infiniteLoopSyncTestGroup		= new TestCaseGroup(eglTestCtx, "sync_status",				"Tests that query the sync status after a context reset has occurred");
		tcu::TestCaseGroup* const infiniteLoopQueryTestGroup	= new TestCaseGroup(eglTestCtx, "query_status",				"Tests that query the state of a query object after a context reset has occurred");
		tcu::TestCaseGroup* const infiniteLoopSharedTestGroup	= new TestCaseGroup(eglTestCtx, "shared_context_status",	"Tests that query the state of a shared context after a reset has occurred");
		tcu::TestCaseGroup* const infiniteLoopRecoverTestGroup	= new TestCaseGroup(eglTestCtx, "recover_from_reset",		"Tests that attempt to create a new context after a context has occurred");

		static const RobustnessTestCase::Params s_infiniteLoopCases[] =
		{
			RobustnessTestCase::Params("vertex",				"Provoke a context reset in vertex shader and ",				CONTEXTRESETTYPE_INFINITE_LOOP,	SHADERTYPE_VERT),
			RobustnessTestCase::Params("fragment",				"Provoke a context reset in fragment shader and ",				CONTEXTRESETTYPE_INFINITE_LOOP,	SHADERTYPE_FRAG),
			RobustnessTestCase::Params("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	CONTEXTRESETTYPE_INFINITE_LOOP,	SHADERTYPE_VERT_AND_FRAG),
			RobustnessTestCase::Params("compute",				"Provoke a context reset in compute shader and ",				CONTEXTRESETTYPE_INFINITE_LOOP,	SHADERTYPE_COMPUTE),
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_infiniteLoopCases); ++testNdx)
		{
			const RobustnessTestCase::Params& test = s_infiniteLoopCases[testNdx];
			infiniteLoopResetTestGroup->addChild	(new BasicResetCase				(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));
			infiniteLoopSyncTestGroup->addChild		(new SyncObjectResetCase		(eglTestCtx, test.getName().c_str(), (test.getDescription() + syncScenarioDescription).c_str(), test));
			infiniteLoopQueryTestGroup->addChild	(new QueryObjectResetCase		(eglTestCtx, test.getName().c_str(), (test.getDescription() + queryScenarioDescription).c_str(), test));
			infiniteLoopSharedTestGroup->addChild	(new SharedContextResetCase		(eglTestCtx, test.getName().c_str(), (test.getDescription() + sharedScenarioDescription).c_str(), test));
			infiniteLoopRecoverTestGroup->addChild	(new RecoverFromResetCase		(eglTestCtx, test.getName().c_str(), (test.getDescription() + recoverScenarioDescription).c_str(), test));
		}

		infiniteLoopTestGroup->addChild(infiniteLoopResetTestGroup);
		infiniteLoopTestGroup->addChild(infiniteLoopSyncTestGroup);
		infiniteLoopTestGroup->addChild(infiniteLoopQueryTestGroup);
		infiniteLoopTestGroup->addChild(infiniteLoopSharedTestGroup);
		infiniteLoopTestGroup->addChild(infiniteLoopRecoverTestGroup);
	}

	// out-of-bounds test cases
	{
		// robust context
		tcu::TestCaseGroup* const uboReadArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "uniform_block",		"Uniform Block Accesses");
		tcu::TestCaseGroup* const uboWriteArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "uniform_block",		"Uniform Block Accesses");
		tcu::TestCaseGroup* const ssboWriteArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "shader_storage_block", "Shader Storage Block accesses");
		tcu::TestCaseGroup* const ssboReadArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "shader_storage_block", "Shader Storage Block accesses");
		tcu::TestCaseGroup* const localWriteArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "local_array",			"Local array accesses");
		tcu::TestCaseGroup* const localReadArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "local_array",			"Local array accesses");

		// non-robust context (internal use only)
		tcu::TestCaseGroup* const uboReadArrayResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "uniform_block",		"Uniform Block Accesses");
		tcu::TestCaseGroup* const uboWriteArrayResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "uniform_block",		"Uniform Block Accesses");
		tcu::TestCaseGroup* const ssboWriteArrayResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "shader_storage_block", "Shader Storage Block accesses");
		tcu::TestCaseGroup* const ssboReadArrayResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "shader_storage_block", "Shader Storage Block accesses");
		tcu::TestCaseGroup* const localWriteArrayResetNonRobustTestGroup	= new TestCaseGroup(eglTestCtx, "local_array",			"Local array accesses");
		tcu::TestCaseGroup* const localReadArrayResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "local_array",			"Local array accesses");

		static const RobustnessTestCase::Params s_outOfBoundReadCases[] =
		{
			// ubo read only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_UBO, READWRITETYPE_READ),

			// ssbo read only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_SSBO, READWRITETYPE_READ),

			// local array read only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),

			// ubo read only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_UBO, READWRITETYPE_READ),

			// ssbo read only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_SSBO, READWRITETYPE_READ),

			// local array read only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_outOfBoundReadCases); ++testNdx)
		{
			const RobustnessTestCase::Params& test = s_outOfBoundReadCases[testNdx];

			if (test.getResourceType() == RESOURCETYPE_UBO && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
				uboReadArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

			if (test.getResourceType() == RESOURCETYPE_UBO && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
				uboReadArrayResetNonRobustTestGroup->addChild		(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

			if (test.getResourceType() == RESOURCETYPE_SSBO && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
				ssboReadArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

			if (test.getResourceType() == RESOURCETYPE_SSBO && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
				ssboReadArrayResetNonRobustTestGroup->addChild		(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

			if (test.getResourceType() == RESOURCETYPE_LOCAL_ARRAY && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
				localReadArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

			if (test.getResourceType() == RESOURCETYPE_LOCAL_ARRAY && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
				localReadArrayResetNonRobustTestGroup->addChild		(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));
		}

		static const RobustnessTestCase::Params s_outOfBoundWriteCases[] =
		{
			// ubo write only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_UBO, READWRITETYPE_WRITE),

			// ssbo write only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_SSBO, READWRITETYPE_WRITE),

			// local array write only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),

			// ubo write only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_UBO, READWRITETYPE_WRITE),

			// ssbo write only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_SSBO, READWRITETYPE_WRITE),

			// local array write only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_outOfBoundWriteCases); ++testNdx)
		{
			const RobustnessTestCase::Params& test = s_outOfBoundWriteCases[testNdx];

				if (test.getResourceType() == RESOURCETYPE_UBO && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
					uboWriteArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

				if (test.getResourceType() == RESOURCETYPE_UBO && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
					uboWriteArrayResetNonRobustTestGroup->addChild		(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

				if (test.getResourceType() == RESOURCETYPE_SSBO && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
					ssboWriteArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

				if (test.getResourceType() == RESOURCETYPE_SSBO && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
					ssboWriteArrayResetNonRobustTestGroup->addChild		(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

				if (test.getResourceType() == RESOURCETYPE_LOCAL_ARRAY && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
					localWriteArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

				if (test.getResourceType() == RESOURCETYPE_LOCAL_ARRAY && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
					localWriteArrayResetNonRobustTestGroup->addChild	(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));
		}

		// robust Context
		tcu::TestCaseGroup* const outOfBoundsResetReadAccessTestGroup	= new TestCaseGroup(eglTestCtx, "reads",	"Out of bounds read accesses");
		tcu::TestCaseGroup* const outOfBoundsResetWriteAccessTestGroup	= new TestCaseGroup(eglTestCtx, "writes",	"Out of bounds write accesses");

		outOfBoundsResetReadAccessTestGroup->addChild(uboReadArrayResetTestGroup);
		outOfBoundsResetReadAccessTestGroup->addChild(ssboReadArrayResetTestGroup);
		outOfBoundsResetReadAccessTestGroup->addChild(localReadArrayResetTestGroup);

		outOfBoundsResetWriteAccessTestGroup->addChild(uboWriteArrayResetTestGroup);
		outOfBoundsResetWriteAccessTestGroup->addChild(ssboWriteArrayResetTestGroup);
		outOfBoundsResetWriteAccessTestGroup->addChild(localWriteArrayResetTestGroup);

		tcu::TestCaseGroup* const outOfBoundsResetTestGroup		= new TestCaseGroup(eglTestCtx, "reset_status",	"Tests that query the reset status after a context reset has occurred");

		outOfBoundsResetTestGroup->addChild(outOfBoundsResetReadAccessTestGroup);
		outOfBoundsResetTestGroup->addChild(outOfBoundsResetWriteAccessTestGroup);

		outOfBoundsTestGroup->addChild(outOfBoundsResetTestGroup);

		// non-robust Context (internal use only)
		tcu::TestCaseGroup* const outOfBoundsResetReadAccessNonRobustTestGroup	= new TestCaseGroup(eglTestCtx, "reads",	"Out of bounds read accesses");
		tcu::TestCaseGroup* const outOfBoundsResetWriteAccessNonRobustTestGroup	= new TestCaseGroup(eglTestCtx, "writes",	"Out of bounds write accesses");

		outOfBoundsResetReadAccessNonRobustTestGroup->addChild(uboReadArrayResetNonRobustTestGroup);
		outOfBoundsResetReadAccessNonRobustTestGroup->addChild(ssboReadArrayResetNonRobustTestGroup);
		outOfBoundsResetReadAccessNonRobustTestGroup->addChild(localReadArrayResetNonRobustTestGroup);

		outOfBoundsResetWriteAccessNonRobustTestGroup->addChild(uboWriteArrayResetNonRobustTestGroup);
		outOfBoundsResetWriteAccessNonRobustTestGroup->addChild(ssboWriteArrayResetNonRobustTestGroup);
		outOfBoundsResetWriteAccessNonRobustTestGroup->addChild(localWriteArrayResetNonRobustTestGroup);

		tcu::TestCaseGroup* const outOfBoundsResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "reset_status",	"Tests that query the reset status after a context reset has occurred");

		outOfBoundsResetNonRobustTestGroup->addChild(outOfBoundsResetReadAccessNonRobustTestGroup);
		outOfBoundsResetNonRobustTestGroup->addChild(outOfBoundsResetWriteAccessNonRobustTestGroup);

		outOfBoundsNonRobustTestGroup->addChild(outOfBoundsResetNonRobustTestGroup);
	}

	// fixed function test cases
	{
		// robust context
		tcu::TestCaseGroup* const fixedFunctionResetStatusTestGroup				= new TestCaseGroup(eglTestCtx, "reset_status",	"Tests that query the reset status after a context reset has occurred");

		// non-robust context (internal use only)
		tcu::TestCaseGroup* const fixedFunctionResetStatusNonRobustTestGroup	= new TestCaseGroup(eglTestCtx, "reset_status",	"Tests that query the reset status after a context reset has occurred");

		static const RobustnessTestCase::Params s_fixedFunctionPipelineCases[] =
		{
			RobustnessTestCase::Params( "index_buffer_out_of_bounds",	"Provoke context reset and query error states and reset notifications", ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_FIXED_FUNC_OOB, FIXEDFUNCTIONTYPE_INDICES),
			RobustnessTestCase::Params( "vertex_buffer_out_of_bounds",	"Provoke context reset and query error states and reset notifications", ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_FIXED_FUNC_OOB, FIXEDFUNCTIONTYPE_VERTICES),

			RobustnessTestCase::Params( "index_buffer_out_of_bounds",	"Provoke context reset and query error states and reset notifications", ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_FIXED_FUNC_OOB, FIXEDFUNCTIONTYPE_INDICES),
			RobustnessTestCase::Params( "vertex_buffer_out_of_bounds",	"Provoke context reset and query error states and reset notifications", ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_FIXED_FUNC_OOB, FIXEDFUNCTIONTYPE_VERTICES),
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_fixedFunctionPipelineCases); ++testNdx)
		{
			const RobustnessTestCase::Params& test = s_fixedFunctionPipelineCases[testNdx];
			if (test.getRobustAccessType() == ROBUSTACCESS_TRUE)
				fixedFunctionResetStatusTestGroup->addChild(new BasicResetCase(eglTestCtx, test.getName().c_str(), test.getDescription().c_str(), test));
			else
				fixedFunctionResetStatusNonRobustTestGroup->addChild(new BasicResetCase(eglTestCtx, test.getName().c_str(), test.getDescription().c_str(), test));
		}

		fixedFunctionTestGroup->addChild(fixedFunctionResetStatusTestGroup);
		fixedFunctionNonRobustTestGroup->addChild(fixedFunctionResetStatusNonRobustTestGroup);
	}

	// context creation query cases
	{
		contextCreationTestGroup->addChild(new QueryRobustAccessCase	(eglTestCtx, "query_robust_access",		"Query robust access after successfully creating a robust context"));
		contextCreationTestGroup->addChild(new NoResetNotificationCase	(eglTestCtx, "no_reset_notification",	"Query reset notification strategy after specifying GL_NO_RESET_NOTIFICATION"));
		contextCreationTestGroup->addChild(new LoseContextOnResetCase	(eglTestCtx, "lose_context_on_reset",	"Query reset notification strategy after specifying GL_LOSE_CONTEXT_ON_RESET"));
	}

	// invalid context creation cases
	{
		negativeContextTestGroup->addChild(new InvalidContextCase		(eglTestCtx, "invalid_robust_context_creation",			"Create a non-robust context but specify a reset notification strategy"));
		negativeContextTestGroup->addChild(new InvalidShareContextCase	(eglTestCtx, "invalid_robust_shared_context_creation",	"Create a context share group with conflicting reset notification strategies"));
	}

	shadersTestGroup->addChild(infiniteLoopTestGroup);
	shadersTestGroup->addChild(outOfBoundsTestGroup);
	shadersTestGroup->addChild(outOfBoundsNonRobustTestGroup);

	contextResetTestGroup->addChild(shadersTestGroup);
	contextResetTestGroup->addChild(fixedFunctionTestGroup);
	contextResetTestGroup->addChild(fixedFunctionNonRobustTestGroup);

	group->addChild(contextCreationTestGroup);
	group->addChild(contextResetTestGroup);
	group->addChild(negativeContextTestGroup);

	return group.release();
}